

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O1

bool __thiscall
json::LoadObject::process<std::vector<obj_array_var1*,std::allocator<obj_array_var1*>>>
          (LoadObject *this,char *name,
          vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_> *value)

{
  ulong uVar1;
  prop_map *papVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  iVar4 = strcmp(this->_prev_name,name);
  if (-1 < iVar4) {
    __assert_fail("false && \"variables should be serialized in alphabetical order\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/yak32[P]glw_json/tests/../glw_json.h"
                  ,0x10c,
                  "bool json::LoadObject::process(const char *, V &) [V = std::vector<obj_array_var1 *>]"
                 );
  }
  this->_prev_name = name;
  uVar1 = this->current;
  if (uVar1 < this->props_size) {
    papVar2 = this->props;
    iVar4 = strncmp(name,(*papVar2)[uVar1].param.str,(*papVar2)[uVar1].param.len);
    if (iVar4 == 0) {
      pcVar5 = load_container<std::vector<obj_array_var1*,std::allocator<obj_array_var1*>>>
                         ((*papVar2)[uVar1].value.str,(*papVar2)[uVar1].value.len,value,
                          this->options);
      sVar3 = this->current;
      if (pcVar5 == (*this->props)[sVar3].value.str + (*this->props)[sVar3].value.len) {
        this->current = sVar3 + 1;
        return true;
      }
      this->error_pos = pcVar5;
      goto LAB_001557a8;
    }
  }
  if ((this->options & 2U) == 0) {
    if ((this->options & 1U) == 0) {
      return true;
    }
    local_48 = (void *)0x0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_>::_M_move_assign
              (value,&local_48);
    if (local_48 == (void *)0x0) {
      return true;
    }
    operator_delete(local_48,local_38 - (long)local_48);
    return true;
  }
LAB_001557a8:
  this->current = this->props_size;
  return false;
}

Assistant:

bool process(const char* name, V& value) {
#ifndef NDEBUG
		// this check could fail if name is dynamically allocated and was freed after usage
		// if Sublime Text 3 is used, select everything inside serialize() and press F9
		if (strcmp(_prev_name, name) >= 0)
			assert(false && "variables should be serialized in alphabetical order");
		_prev_name = name;
#endif
		if (current < props_size &&
			strncmp(name, props[current].param.str, props[current].param.len) == 0) {
			const char* end =
				load(props[current].value.str, props[current].value.len, value, options);
			if (end == props[current].value.str + props[current].value.len) {
				++current;
				return true;
			}
			error_pos = end;
		}
		else if (!(options & ERROR_IF_ABSENT)) {
			if (options & RESET_IF_ABSENT)
				value = V();
			return true;
		}
		current = props_size; // skip parsing
		return false;
	}